

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O3

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  size_t *len;
  char **p;
  size_t *len_00;
  int64_t *piVar1;
  ulong length;
  mode_t mVar2;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  archive_string_conv *sc;
  char *pcVar6;
  size_t sVar7;
  archive_string *paVar8;
  int *piVar9;
  char *pcVar10;
  archive_entry *paVar11;
  int64_t iVar12;
  size_t length_00;
  char buff [512];
  int local_254;
  archive_string local_238 [21];
  
  piVar1 = (int64_t *)a->format_data;
  sc = (archive_string_conv *)piVar1[10];
  if (sc == (archive_string_conv *)0x0) {
    if ((int)piVar1[0xc] == 0) {
      sc = archive_string_default_conversion_for_write(&a->archive);
      piVar1[0xb] = (int64_t)sc;
      *(undefined4 *)(piVar1 + 0xc) = 1;
    }
    else {
      sc = (archive_string_conv *)piVar1[0xb];
    }
  }
  pcVar6 = archive_entry_hardlink(entry);
  if (((pcVar6 != (char *)0x0) || (pcVar6 = archive_entry_symlink(entry), pcVar6 != (char *)0x0)) ||
     (mVar2 = archive_entry_filetype(entry), mVar2 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar2 = archive_entry_filetype(entry);
  if (((mVar2 == 0x4000) && (pcVar6 = archive_entry_pathname(entry), pcVar6 != (char *)0x0)) &&
     (sVar7 = strlen(pcVar6), pcVar6[sVar7 - 1] != '/')) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    sVar7 = strlen(pcVar6);
    paVar8 = archive_string_ensure(local_238,sVar7 + 2);
    if (paVar8 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
      archive_string_free(local_238);
      return -0x1e;
    }
    local_238[0].length = 0;
    archive_strncat(local_238,pcVar6,sVar7);
    archive_strappend_char(local_238,'/');
    archive_entry_copy_pathname(entry,local_238[0].s);
    archive_string_free(local_238);
  }
  len = (size_t *)(piVar1 + 5);
  wVar3 = _archive_entry_pathname_l(entry,(char **)(piVar1 + 4),len,sc);
  if (wVar3 == L'\0') {
    local_254 = 0;
  }
  else {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      pcVar6 = "Can\'t allocate memory for Pathame";
      goto LAB_00146fa8;
    }
    pcVar6 = archive_entry_pathname(entry);
    pcVar10 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar6,pcVar10);
    local_254 = -0x14;
  }
  wVar3 = _archive_entry_uname_l(entry,(char **)(piVar1 + 6),(size_t *)(piVar1 + 7),sc);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      pcVar6 = "Can\'t allocate memory for Uname";
      goto LAB_00146fa8;
    }
    pcVar6 = archive_entry_uname(entry);
    pcVar10 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to %s",pcVar6,pcVar10);
    local_254 = -0x14;
  }
  wVar3 = _archive_entry_gname_l(entry,(char **)(piVar1 + 8),(size_t *)(piVar1 + 9),sc);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      pcVar6 = "Can\'t allocate memory for Gname";
      goto LAB_00146fa8;
    }
    pcVar6 = archive_entry_gname(entry);
    pcVar10 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to %s",pcVar6,pcVar10);
    local_254 = -0x14;
  }
  p = (char **)(piVar1 + 2);
  len_00 = (size_t *)(piVar1 + 3);
  wVar3 = _archive_entry_hardlink_l(entry,p,len_00,sc);
  if (wVar3 == L'\0') {
LAB_00147062:
    length_00 = *len_00;
    if (length_00 != 0) goto LAB_0014710a;
    wVar3 = _archive_entry_symlink_l(entry,p,len_00,sc);
    if (wVar3 != L'\0') {
      piVar9 = __errno_location();
      if (*piVar9 == 0xc) goto LAB_00147095;
      pcVar6 = archive_entry_hardlink(entry);
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
      local_254 = -0x14;
    }
    length_00 = *len_00;
LAB_0014710a:
    if (100 < length_00) {
      paVar11 = archive_entry_new2(&a->archive);
      archive_entry_set_uname(paVar11,"root");
      archive_entry_set_gname(paVar11,"wheel");
      archive_entry_set_pathname(paVar11,"././@LongLink");
      archive_entry_set_size(paVar11,*len_00 + 1);
      iVar4 = archive_format_gnutar_header(a,(char *)local_238,paVar11,0x4b);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      iVar4 = __archive_write_output(a,local_238,0x200);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      archive_entry_free(paVar11);
      iVar4 = __archive_write_output(a,*p,length_00);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      iVar4 = __archive_write_nulls(a,(ulong)(-(int)length_00 & 0x1ff));
      if (iVar4 < -0x14) {
        return iVar4;
      }
    }
    length = *len;
    if (100 < length) {
      pcVar6 = (char *)piVar1[4];
      paVar11 = archive_entry_new2(&a->archive);
      archive_entry_set_uname(paVar11,"root");
      archive_entry_set_gname(paVar11,"wheel");
      archive_entry_set_pathname(paVar11,"././@LongLink");
      archive_entry_set_size(paVar11,*len + 1);
      iVar4 = archive_format_gnutar_header(a,(char *)local_238,paVar11,0x4c);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      iVar4 = __archive_write_output(a,local_238,0x200);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      archive_entry_free(paVar11);
      iVar4 = __archive_write_output(a,pcVar6,length);
      if (iVar4 < -0x14) {
        return iVar4;
      }
      iVar4 = __archive_write_nulls(a,(ulong)(-(int)length & 0x1ff));
      if (iVar4 < -0x14) {
        return iVar4;
      }
    }
    pcVar6 = archive_entry_hardlink(entry);
    iVar4 = 0x31;
    if (pcVar6 == (char *)0x0) {
      mVar2 = archive_entry_filetype(entry);
      switch(mVar2 << 0x14 | mVar2 - 0x1000 >> 0xc) {
      case 0:
        iVar4 = 0x36;
        break;
      case 1:
        iVar4 = 0x33;
        break;
      default:
        mVar2 = archive_entry_mode(entry);
        archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)",(ulong)mVar2
                         );
        return -0x19;
      case 3:
        iVar4 = 0x35;
        break;
      case 5:
        iVar4 = 0x34;
        break;
      case 7:
        iVar4 = 0x30;
        break;
      case 9:
        iVar4 = 0x32;
        break;
      case 0xb:
        archive_set_error(&a->archive,0x54,"tar format cannot archive socket");
        return -0x19;
      }
    }
    iVar5 = archive_format_gnutar_header(a,(char *)local_238,entry,iVar4);
    iVar4 = iVar5;
    if ((-0x15 < iVar5) && (iVar4 = __archive_write_output(a,local_238,0x200), -0x15 < iVar4)) {
      if (local_254 < iVar5) {
        iVar5 = local_254;
      }
      if (iVar4 < iVar5) {
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
      iVar12 = archive_entry_size(entry);
      *piVar1 = iVar12;
      piVar1[1] = (ulong)(-(int)iVar12 & 0x1ff);
    }
    return iVar4;
  }
  piVar9 = __errno_location();
  if (*piVar9 != 0xc) {
    pcVar6 = archive_entry_hardlink(entry);
    pcVar10 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
    local_254 = -0x14;
    goto LAB_00147062;
  }
LAB_00147095:
  pcVar6 = "Can\'t allocate memory for Linkname";
LAB_00146fa8:
  archive_set_error(&a->archive,0xc,pcVar6);
  return -0x1e;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	int tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathame");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t todo = gnutar->linkname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->linkname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, gnutar->linkname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t todo = gnutar->pathname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->pathname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, pathname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink(entry) != NULL) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		case AE_IFSOCK:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive socket");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive this (mode=0%lo)",
			    (unsigned long)archive_entry_mode(entry));
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}